

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

void __thiscall capnp::Type::requireUsableAs(Type *this,Type expected)

{
  bool bVar1;
  uint uVar2;
  bool local_79;
  Schema local_78 [3];
  Fault local_60;
  Fault f;
  DebugComparison<const_capnp::schema::Type::Which_&,_capnp::schema::Type::Which_&> local_50;
  bool local_21;
  Type *pTStack_20;
  bool _kjCondition;
  Type *this_local;
  Type expected_local;
  
  expected_local._0_8_ = expected.field_4;
  this_local = expected._0_8_;
  pTStack_20 = this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->baseType);
  kj::_::DebugExpression<capnp::schema::Type::Which_const&>::operator==
            (&local_50,(DebugExpression<capnp::schema::Type::Which_const&> *)&f,(Which *)&this_local
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_50);
  local_79 = false;
  if (bVar1) {
    local_79 = this->listDepth == this_local._2_1_;
  }
  local_21 = local_79;
  if (local_79 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[60]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x38c,FAILED,"baseType == expected.baseType && listDepth == expected.listDepth",
               "_kjCondition,\"This type is not compatible with the requested native type.\"",
               &local_21,
               (char (*) [60])"This type is not compatible with the requested native type.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  uVar2 = (uint)this->baseType;
  if (0xd < uVar2) {
    if (uVar2 == 0xe) {
      kj::_::unreachable();
    }
    if (uVar2 - 0xf < 3) {
      Schema::Schema(local_78,(this->field_4).schema);
      Schema::requireUsableAs(local_78,*(RawSchema **)expected_local._0_8_);
    }
  }
  return;
}

Assistant:

void Type::requireUsableAs(Type expected) const {
  KJ_REQUIRE(baseType == expected.baseType && listDepth == expected.listDepth,
             "This type is not compatible with the requested native type.");

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::ANY_POINTER:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      Schema(schema).requireUsableAs(expected.schema->generic);
      break;

    case schema::Type::LIST:
      KJ_UNREACHABLE;
  }
}